

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O3

bool icu_63::number::impl::blueprint_helpers::parseFracSigOption
               (StringSegment *segment,MacroProps *macros,UErrorCode *status)

{
  FractionSignificantSettings FVar1;
  char16_t cVar2;
  int32_t iVar3;
  uint index;
  Precision local_48;
  
  index = 0;
  cVar2 = numparse::impl::StringSegment::charAt(segment,0);
  if (cVar2 != L'@') goto LAB_0026ca5c;
  iVar3 = numparse::impl::StringSegment::length(segment);
  if (0 < iVar3) {
    index = 0;
    do {
      cVar2 = numparse::impl::StringSegment::charAt(segment,index);
      if (cVar2 != L'@') break;
      index = index + 1;
      iVar3 = numparse::impl::StringSegment::length(segment);
    } while ((int)index < iVar3);
  }
  iVar3 = numparse::impl::StringSegment::length(segment);
  if ((int)index < iVar3) {
    cVar2 = numparse::impl::StringSegment::charAt(segment,index);
    if (cVar2 == L'+') {
      iVar3 = numparse::impl::StringSegment::length(segment);
      if (iVar3 <= (int)(index + 1)) {
        FractionPrecision::withMinDigits(&local_48,(FractionPrecision *)&macros->precision,index);
LAB_0026ca7c:
        FVar1.fMinSig = local_48.fUnion.fracSig.fMinSig;
        FVar1.fMaxSig = local_48.fUnion.fracSig.fMaxSig;
        FVar1.fMinFrac = local_48.fUnion.fracSig.fMinFrac;
        FVar1.fMaxFrac = local_48.fUnion.fracSig.fMaxFrac;
        *(ulong *)((long)&(macros->precision).fUnion.increment.fIncrement + 4) =
             CONCAT44(local_48.fUnion._8_4_,local_48.fUnion._4_4_);
        *(undefined8 *)((long)&(macros->precision).fUnion + 0xc) = local_48._20_8_;
        (macros->precision).fType = local_48.fType;
        *(undefined4 *)&(macros->precision).field_0x4 = local_48._4_4_;
        (macros->precision).fUnion.fracSig = FVar1;
        index = 1;
        goto LAB_0026ca5c;
      }
    }
    else if (index < 2) {
      while( true ) {
        iVar3 = numparse::impl::StringSegment::length(segment);
        if (iVar3 <= (int)index) break;
        cVar2 = numparse::impl::StringSegment::charAt(segment,index);
        if (cVar2 != L'#') break;
        index = index + 1;
      }
      iVar3 = numparse::impl::StringSegment::length(segment);
      if (iVar3 <= (int)index) {
        FractionPrecision::withMaxDigits(&local_48,(FractionPrecision *)&macros->precision,index);
        goto LAB_0026ca7c;
      }
    }
  }
  *status = U_NUMBER_SKELETON_SYNTAX_ERROR;
  index = 0;
LAB_0026ca5c:
  return SUB41(index,0);
}

Assistant:

bool blueprint_helpers::parseFracSigOption(const StringSegment& segment, MacroProps& macros,
                                           UErrorCode& status) {
    if (segment.charAt(0) != u'@') {
        return false;
    }
    int offset = 0;
    int minSig = 0;
    int maxSig;
    for (; offset < segment.length(); offset++) {
        if (segment.charAt(offset) == u'@') {
            minSig++;
        } else {
            break;
        }
    }
    // For the frac-sig option, there must be minSig or maxSig but not both.
    // Valid: @+, @@+, @@@+
    // Valid: @#, @##, @###
    // Invalid: @, @@, @@@
    // Invalid: @@#, @@##, @@@#
    if (offset < segment.length()) {
        if (segment.charAt(offset) == u'+') {
            maxSig = -1;
            offset++;
        } else if (minSig > 1) {
            // @@#, @@##, @@@#
            // throw new SkeletonSyntaxException("Invalid digits option for fraction rounder", segment);
            status = U_NUMBER_SKELETON_SYNTAX_ERROR;
            return false;
        } else {
            maxSig = minSig;
            for (; offset < segment.length(); offset++) {
                if (segment.charAt(offset) == u'#') {
                    maxSig++;
                } else {
                    break;
                }
            }
        }
    } else {
        // @, @@, @@@
        // throw new SkeletonSyntaxException("Invalid digits option for fraction rounder", segment);
        status = U_NUMBER_SKELETON_SYNTAX_ERROR;
        return false;
    }
    if (offset < segment.length()) {
        // throw new SkeletonSyntaxException("Invalid digits option for fraction rounder", segment);
        status = U_NUMBER_SKELETON_SYNTAX_ERROR;
        return false;
    }

    auto& oldPrecision = static_cast<const FractionPrecision&>(macros.precision);
    if (maxSig == -1) {
        macros.precision = oldPrecision.withMinDigits(minSig);
    } else {
        macros.precision = oldPrecision.withMaxDigits(maxSig);
    }
    return true;
}